

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

void __thiscall
duckdb::Relation::Create
          (Relation *this,string *table_name,bool temporary,OnCreateConflict on_conflict)

{
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_4b0ffdd + 9,&local_49);
  Create(this,&local_48,table_name,temporary,on_conflict);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Relation::Create(const string &table_name, bool temporary, OnCreateConflict on_conflict) {
	Create(INVALID_SCHEMA, table_name, temporary, on_conflict);
}